

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  ostream *poVar2;
  int __oflag;
  undefined1 local_c8 [8];
  JPG jpg;
  undefined1 local_80 [8];
  BMPReader bmpReader;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string path;
  
  path.field_2._12_4_ = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"start");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/",
             &local_31);
  std::allocator<char>::~allocator(&local_31);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &bmpReader.data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 "example.bmp");
  std::__cxx11::string::operator=((string *)local_30,(string *)&bmpReader.data);
  std::__cxx11::string::~string((string *)&bmpReader.data);
  BMPReader::BMPReader((BMPReader *)local_80);
  uVar1 = BMPReader::open((BMPReader *)local_80,(char *)local_30,__oflag);
  if ((uVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Error - canot open file\n");
    path.field_2._12_4_ = 1;
    jpg._60_4_ = 1;
  }
  else {
    JPG::JPG((JPG *)local_c8,local_80._4_4_,local_80._0_4_,(RGB *)bmpReader._8_8_,'\x02','\x02',
             '\x01','\x02','\x02','\x01');
    JPG::convertToYCbCr((JPG *)local_c8);
    JPG::subsampling((JPG *)local_c8);
    printJPG((JPG *)local_c8);
    poVar2 = std::operator<<((ostream *)&std::cout,"end");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    path.field_2._12_4_ = 0;
    jpg._60_4_ = 1;
    JPG::~JPG((JPG *)local_c8);
  }
  BMPReader::~BMPReader((BMPReader *)local_80);
  std::__cxx11::string::~string((string *)local_30);
  return path.field_2._12_4_;
}

Assistant:

int main() {
    std::cout << "start" << std::endl;
    std::string path(RESOURCE_PATH);
    path = path + "example.bmp";
    BMPReader bmpReader;
    if(!bmpReader.open(path)) {
        std::cout << "Error - canot open file\n" ;
        return 1;
    }
    JPG jpg(bmpReader.width, bmpReader.height, bmpReader.data, 2, 2, 1, 2, 2, 1) ;
    jpg.convertToYCbCr();
    jpg.subsampling();
    printJPG(jpg);

   // jpg.discreteCosineTransform();
   // jpg.quantization();
   // jpg.huffmanCoding();
   // std::string jpgPath(EXAMPLE_PATH_JPG);
   // jpg.output(jpgPath);
    std::cout << "end" << std::endl;
    return 0;
}